

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_file_stat_internal
                  (mz_zip_archive *pZip,mz_uint file_index,mz_uint8 *pCentral_dir_header,
                  mz_zip_archive_file_stat *pStat,mz_bool *pFound_zip64_extra_data)

{
  uint uVar1;
  time_t tVar2;
  uint *in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  mz_uint32 field_data_remaining;
  mz_uint8 *pField_data;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  mz_uint8 *pExtra_data;
  mz_uint32 extra_size_remaining;
  mz_uint8 *p;
  mz_uint n;
  long local_e0;
  long local_d8;
  undefined8 in_stack_ffffffffffffff30;
  ulong uVar3;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar4;
  uint local_c0;
  mz_uint in_stack_ffffffffffffff44;
  mz_zip_archive *in_stack_ffffffffffffff48;
  short *psVar5;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  short *local_a8;
  uint local_9c;
  mz_bool local_60;
  
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  if ((in_RDX == 0) || (in_RCX == (uint *)0x0)) {
    if (in_RDI != 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 0x18;
    }
    local_60 = 0;
  }
  else {
    *in_RCX = in_ESI;
    *(ulong *)(in_RCX + 2) =
         (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x20) + (ulong)in_ESI * 4);
    *(undefined2 *)(in_RCX + 4) = *(undefined2 *)(in_RDX + 4);
    *(undefined2 *)((long)in_RCX + 0x12) = *(undefined2 *)(in_RDX + 6);
    *(undefined2 *)(in_RCX + 5) = *(undefined2 *)(in_RDX + 8);
    *(undefined2 *)((long)in_RCX + 0x16) = *(undefined2 *)(in_RDX + 10);
    tVar2 = mz_zip_dos_to_time_t(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    *(time_t *)(in_RCX + 6) = tVar2;
    in_RCX[8] = *(uint *)(in_RDX + 0x10);
    *(ulong *)(in_RCX + 10) = (ulong)*(uint *)(in_RDX + 0x14);
    *(ulong *)(in_RCX + 0xc) = (ulong)*(uint *)(in_RDX + 0x18);
    *(undefined2 *)(in_RCX + 0xe) = *(undefined2 *)(in_RDX + 0x24);
    in_RCX[0xf] = *(uint *)(in_RDX + 0x26);
    *(ulong *)(in_RCX + 0x10) = (ulong)*(uint *)(in_RDX + 0x2a);
    local_c0 = (uint)*(ushort *)(in_RDX + 0x1c);
    if (0x1fe < local_c0) {
      local_c0 = 0x1ff;
    }
    memcpy(in_RCX + 0x16,(void *)(in_RDX + 0x2e),(ulong)local_c0);
    *(undefined1 *)((long)in_RCX + (ulong)local_c0 + 0x58) = 0;
    uVar1 = (uint)*(ushort *)(in_RDX + 0x20);
    if (0x1fe < uVar1) {
      uVar1 = 0x1ff;
    }
    in_RCX[0x12] = uVar1;
    uVar4 = uVar1;
    memcpy(in_RCX + 0x96,
           (void *)(in_RDX + 0x2e + (long)(int)(uint)*(ushort *)(in_RDX + 0x1c) +
                   (long)(int)(uint)*(ushort *)(in_RDX + 0x1e)),(ulong)uVar1);
    *(undefined1 *)((long)in_RCX + (ulong)uVar1 + 600) = 0;
    uVar1 = mz_zip_reader_is_file_a_directory(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    in_RCX[0x13] = uVar1;
    uVar1 = mz_zip_reader_is_file_encrypted
                      ((mz_zip_archive *)CONCAT44(uVar4,in_stack_ffffffffffffff38),
                       (mz_uint)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    in_RCX[0x14] = uVar1;
    uVar1 = mz_zip_reader_is_file_supported(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    in_RCX[0x15] = uVar1;
    if (*(ulong *)(in_RCX + 0xc) < *(ulong *)(in_RCX + 10)) {
      uVar3 = *(ulong *)(in_RCX + 10);
    }
    else {
      uVar3 = *(ulong *)(in_RCX + 0xc);
    }
    if (*(ulong *)(in_RCX + 0x10) < uVar3) {
      if (*(ulong *)(in_RCX + 0xc) < *(ulong *)(in_RCX + 10)) {
        local_d8 = *(long *)(in_RCX + 10);
      }
      else {
        local_d8 = *(long *)(in_RCX + 0xc);
      }
      local_e0 = local_d8;
    }
    else {
      local_e0 = *(long *)(in_RCX + 0x10);
    }
    if ((local_e0 == 0xffffffff) && (local_9c = (uint)*(ushort *)(in_RDX + 0x1e), local_9c != 0)) {
      local_a8 = (short *)(in_RDX + 0x2e + (long)(int)(uint)*(ushort *)(in_RDX + 0x1c));
      do {
        if (local_9c < 4) {
          if (in_RDI != 0) {
            *(undefined4 *)(in_RDI + 0x1c) = 9;
          }
          return 0;
        }
        uVar1 = (uint)(ushort)local_a8[1];
        if (local_9c < uVar1 + 4) {
          if (in_RDI != 0) {
            *(undefined4 *)(in_RDI + 0x1c) = 9;
          }
          return 0;
        }
        if (*local_a8 == 1) {
          psVar5 = local_a8 + 2;
          if (in_R8 != (undefined4 *)0x0) {
            *in_R8 = 1;
          }
          if (*(long *)(in_RCX + 0xc) == 0xffffffff) {
            if (uVar1 < 8) {
              if (in_RDI != 0) {
                *(undefined4 *)(in_RDI + 0x1c) = 9;
              }
              return 0;
            }
            *(undefined8 *)(in_RCX + 0xc) = *(undefined8 *)psVar5;
            psVar5 = local_a8 + 6;
            uVar1 = uVar1 - 8;
          }
          if (*(long *)(in_RCX + 10) == 0xffffffff) {
            if (uVar1 < 8) {
              if (in_RDI != 0) {
                *(undefined4 *)(in_RDI + 0x1c) = 9;
              }
              return 0;
            }
            *(undefined8 *)(in_RCX + 10) = *(undefined8 *)psVar5;
            psVar5 = psVar5 + 4;
            uVar1 = uVar1 - 8;
          }
          if (*(long *)(in_RCX + 0x10) == 0xffffffff) {
            if (uVar1 < 8) {
              if (in_RDI != 0) {
                *(undefined4 *)(in_RDI + 0x1c) = 9;
              }
              return 0;
            }
            *(undefined8 *)(in_RCX + 0x10) = *(undefined8 *)psVar5;
          }
          break;
        }
        local_a8 = (short *)((ulong)uVar1 + 4 + (long)local_a8);
        local_9c = (local_9c - 4) - uVar1;
      } while (local_9c != 0);
    }
    local_60 = 1;
  }
  return local_60;
}

Assistant:

static mz_bool mz_zip_file_stat_internal(mz_zip_archive* pZip,
                                         mz_uint file_index,
                                         const mz_uint8* pCentral_dir_header,
                                         mz_zip_archive_file_stat* pStat,
                                         mz_bool* pFound_zip64_extra_data) {

    mz_uint n;
    const mz_uint8* p = pCentral_dir_header;

    if (pFound_zip64_extra_data)
        *pFound_zip64_extra_data = MZ_FALSE;

    if ((!p) || (!pStat))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Extract fields from the central directory record. */
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
    pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
    pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
    pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
    pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
    pStat->m_time = mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                                         MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
    pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
    pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
    pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
    pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
    pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
    pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

    /* Copy as much of the filename and comment as possible. */
    n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
    memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pStat->m_filename[n] = '\0';

    n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
    pStat->m_comment_size = n;
    memcpy(pStat->m_comment,
           p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS)
                   + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
           n);
    pStat->m_comment[n] = '\0';

    /* Set some flags for convienance */
    pStat->m_is_directory = mz_zip_reader_is_file_a_directory(pZip, file_index);
    pStat->m_is_encrypted = mz_zip_reader_is_file_encrypted(pZip, file_index);
    pStat->m_is_supported = mz_zip_reader_is_file_supported(pZip, file_index);

    /* See if we need to read any zip64 extended information fields. */
    /* Confusingly, these zip64 fields can be present even on non-zip64 archives (Debian zip on a huge files from stdin piped to stdout creates them). */
    if (MZ_MAX(MZ_MAX(pStat->m_comp_size, pStat->m_uncomp_size), pStat->m_local_header_ofs) == MZ_UINT32_MAX) {
        /* Attempt to find zip64 extended information field in the entry's extra data */
        mz_uint32 extra_size_remaining = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

        if (extra_size_remaining) {
            const mz_uint8* pExtra_data =
                                  p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);

            do {
                mz_uint32 field_id;
                mz_uint32 field_data_size;

                if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                field_id = MZ_READ_LE16(pExtra_data);
                field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
                    const mz_uint8* pField_data = pExtra_data + sizeof(mz_uint16) * 2;
                    mz_uint32 field_data_remaining = field_data_size;

                    if (pFound_zip64_extra_data)
                        *pFound_zip64_extra_data = MZ_TRUE;

                    if (pStat->m_uncomp_size == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_uncomp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_comp_size == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_comp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_local_header_ofs == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_local_header_ofs = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    break;
                }

                pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
            } while (extra_size_remaining);
        }
    }

    return MZ_TRUE;
}